

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ChangeCountFlags
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  DObject *this;
  int iVar6;
  char *pcVar7;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003e80e2;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e80d2:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e80e2:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11cf,
                  "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_003e7f54;
    bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e80e2;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_003e80d2;
LAB_003e7f54:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e8132:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x11d0,
                    "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar5 = param[1].field_0.i;
LAB_003e7fa3:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e8151:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x11d1,
                    "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[2].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e8132;
    }
    iVar5 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e7fa3;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e8151;
    }
    iVar6 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e8101;
      }
      goto LAB_003e7fbd;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e8101:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11d2,
                  "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e7fbd:
  iVar1 = param[3].field_0.i;
  uVar3 = *(uint *)((long)&this[0xb]._vptr_DObject + 4);
  if (((uVar3 & 0x8400000) == 0x400000) && (0 < *(int *)((long)&this[0xc].GCNext + 4))) {
    level.total_monsters = level.total_monsters + -1;
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + -1;
  }
  uVar4 = *(uint *)((long)&this[0xb].ObjNext + 4);
  if ((uVar4 & 0x10) != 0) {
    level.total_secrets = level.total_secrets + -1;
  }
  if (iVar5 != -1) {
    if (iVar5 == 0) {
      uVar3 = uVar3 & 0xffbfffff;
    }
    else {
      uVar3 = uVar3 | 0x400000;
    }
    *(uint *)((long)&this[0xb]._vptr_DObject + 4) = uVar3;
  }
  if (iVar6 != -1) {
    if (iVar6 == 0) {
      uVar3 = uVar3 & 0xff7fffff;
    }
    else {
      uVar3 = uVar3 | 0x800000;
    }
    *(uint *)((long)&this[0xb]._vptr_DObject + 4) = uVar3;
  }
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      uVar4 = uVar4 & 0xffffffef;
    }
    else {
      uVar4 = uVar4 | 0x10;
    }
    *(uint *)((long)&this[0xb].ObjNext + 4) = uVar4;
  }
  if (((uVar3 & 0x8400000) == 0x400000) && (0 < *(int *)((long)&this[0xc].GCNext + 4))) {
    level.total_monsters = level.total_monsters + 1;
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + 1;
  }
  if ((uVar4 & 0x10) != 0) {
    level.total_secrets = level.total_secrets + 1;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeCountFlags)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(kill);
	PARAM_INT_DEF(item);
	PARAM_INT_DEF(secret);

	if (self->CountsAsKill() && self->health > 0) --level.total_monsters;
	if (self->flags & MF_COUNTITEM) --level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) --level.total_secrets;

	if (kill != -1)
	{
		if (kill == 0) self->flags &= ~MF_COUNTKILL;
		else self->flags |= MF_COUNTKILL;
	}

	if (item != -1)
	{
		if (item == 0) self->flags &= ~MF_COUNTITEM;
		else self->flags |= MF_COUNTITEM;
	}

	if (secret != -1)
	{
		if (secret == 0) self->flags5 &= ~MF5_COUNTSECRET;
		else self->flags5 |= MF5_COUNTSECRET;
	}
	if (self->CountsAsKill() && self->health > 0) ++level.total_monsters;
	if (self->flags & MF_COUNTITEM) ++level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
	return 0;
}